

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O1

void __thiscall
QtMWidgets::AbstractScrollArea::resizeEvent(AbstractScrollArea *this,QResizeEvent *e)

{
  QStyleOption opt;
  QStyleOption aQStack_58 [64];
  
  QStyleOption::QStyleOption(aQStack_58,1,0);
  QStyleOption::initFrom((QWidget *)aQStack_58);
  AbstractScrollAreaPrivate::layoutChildren((this->d).d,aQStack_58);
  AbstractScrollAreaPrivate::normalizePosition((this->d).d);
  AbstractScrollAreaPrivate::calcIndicators((this->d).d);
  QWidget::update();
  e[0xc] = (QResizeEvent)0x1;
  QStyleOption::~QStyleOption(aQStack_58);
  return;
}

Assistant:

void
AbstractScrollArea::resizeEvent( QResizeEvent * e )
{
	QStyleOption opt;
	opt.initFrom( this );

	d->layoutChildren( opt );
	d->normalizePosition();
	d->calcIndicators();

	update();

	e->accept();
}